

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

int64_t __thiscall leveldb::VersionSet::NumLevelBytes(VersionSet *this,int level)

{
  int64_t iVar1;
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x485,"int64_t leveldb::VersionSet::NumLevelBytes(int) const");
  }
  if ((uint)level < 7) {
    iVar1 = TotalFileSize(this->current_->files_ + (uint)level);
    return iVar1;
  }
  __assert_fail("level < config::kNumLevels",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                ,0x486,"int64_t leveldb::VersionSet::NumLevelBytes(int) const");
}

Assistant:

int64_t VersionSet::NumLevelBytes(int level) const {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  return TotalFileSize(current_->files_[level]);
}